

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int planxythetalat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                  bool forwardSearch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  FILE *pFVar5;
  byte bVar6;
  int iVar7;
  undefined8 uVar8;
  ARAPlanner *this;
  ADPlanner *this_00;
  anaPlanner *this_01;
  size_type sVar9;
  uint *puVar10;
  reference pvVar11;
  byte in_CL;
  vector *in_RSI;
  undefined4 in_EDI;
  double dVar12;
  double dVar13;
  uint i_1;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  int theta;
  int y;
  int x;
  size_t i;
  FILE *fSol;
  char *sol;
  SBPLPlanner *planner;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  double halflength;
  double halfwidth;
  sbpl_2Dpt_t pt_m;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  bool bforwardsearch;
  bool bsearchuntilfirstsolution;
  MDPConfig MDPCfg;
  double initialEpsilon;
  double allocated_time_secs;
  int bRet;
  char *in_stack_fffffffffffffc38;
  EnvironmentNAVXYTHETALAT *in_stack_fffffffffffffc40;
  value_type *in_stack_fffffffffffffc48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc50;
  uint local_2d4;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> local_2d0;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  ulong local_2a8;
  FILE *local_2a0;
  char *local_298;
  undefined4 local_28c;
  ARAPlanner *local_288;
  vector<int,_std::allocator<int>_> local_280;
  _IO_FILE local_268 [2];
  double local_88;
  double local_80;
  sbpl_2Dpt_t local_68;
  char local_58 [30];
  byte local_3a;
  byte local_39;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  byte local_19;
  vector *local_10;
  undefined4 local_8;
  int local_4;
  
  local_3a = in_CL & 1;
  local_20 = 0;
  local_28 = 0x4024000000000000;
  local_30 = 0x4008000000000000;
  local_39 = 0;
  local_19 = local_3a;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x10d25d);
  sbpl_2Dpt_t::sbpl_2Dpt_t(&local_68);
  local_80 = 0.01;
  local_88 = 0.01;
  local_68.x = -0.01;
  local_68.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  local_68.x = local_88;
  local_68.y = -local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  local_68.x = local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  local_68.x = -local_88;
  local_68.y = local_80;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::clear
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)0x10d3a5);
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(in_stack_fffffffffffffc40);
  bVar6 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)local_268,local_10,local_58);
  if ((bVar6 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar6 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)local_268);
  if ((bVar6 & 1) == 0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10d535);
  local_288 = (ARAPlanner *)0x0;
  switch(local_8) {
  case 0:
    printf("Initializing ADPlanner...\n");
    this_00 = (ADPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner(this_00,(DiscreteSpaceInformation *)local_268,(bool)(local_3a & 1));
    local_288 = (ARAPlanner *)this_00;
    break;
  case 1:
    printf("Initializing ARAPlanner...\n");
    this = (ARAPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner(this,(DiscreteSpaceInformation *)local_268,(bool)(local_3a & 1));
    local_288 = this;
    break;
  default:
    printf("Invalid planner type\n");
    break;
  case 3:
    printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
    local_4 = 0;
    local_28c = 1;
    goto LAB_0010dd6e;
  case 5:
    printf("Initializing anaPlanner...\n");
    this_01 = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this_01,(DiscreteSpaceInformation *)local_268,(bool)(local_3a & 1));
    local_288 = (ARAPlanner *)this_01;
  }
  iVar7 = (**(code **)(*(long *)local_288 + 0x28))(local_288,local_38);
  if (iVar7 == 0) {
    printf("ERROR: failed to set start state\n");
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar7 = (**(code **)(*(long *)local_288 + 0x20))(local_288,local_34);
  if (iVar7 == 0) {
    printf("ERROR: failed to set goal state\n");
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*(long *)local_288 + 0x90))(local_30);
  (**(code **)(*(long *)local_288 + 0x40))(local_288,local_39 & 1);
  printf("start planning...\n");
  local_20 = (*(code *)**(undefined8 **)local_288)(local_28,local_288,&local_280);
  printf("done planning\n");
  sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_280);
  printf("size of solution=%d\n",sVar9 & 0xffffffff);
  EnvironmentNAVXYTHETALATTICE::PrintTimeStat(local_268);
  local_298 = "sol.txt";
  local_2a0 = fopen("sol.txt","w");
  if (local_2a0 == (FILE *)0x0) {
    uVar8 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar8,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  for (local_2a8 = 0; uVar4 = local_2a8,
      sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_280), uVar4 < sVar9;
      local_2a8 = local_2a8 + 1) {
    puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_280,local_2a8);
    EnvironmentNAVXYTHETALAT::GetCoordFromState
              ((int)local_268,(int *)(ulong)*puVar10,(int *)&local_2ac,(int *)&local_2b0);
    pFVar5 = local_2a0;
    uVar3 = local_2ac;
    uVar2 = local_2b0;
    uVar1 = local_2b4;
    dVar12 = (double)(int)local_2ac;
    dVar13 = (double)(int)local_2b0;
    uVar8 = DiscTheta2Cont(local_2b4,0x10);
    fprintf(pFVar5,"%d %d %d\t\t%.3f %.3f %.3f\n",dVar12 * 0.1 + 0.05,SUB84(dVar13 * 0.1 + 0.05,0),
            uVar8,(ulong)uVar3,(ulong)uVar2,(ulong)uVar1);
  }
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)0x10db70);
  EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
            ((vector *)local_268,(vector *)&local_280);
  sVar9 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size(&local_2d0);
  printf("solution size=%d\n",sVar9 & 0xffffffff);
  for (local_2d4 = 0;
      sVar9 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::size(&local_2d0)
      , pFVar5 = local_2a0, local_2d4 < sVar9; local_2d4 = local_2d4 + 1) {
    pvVar11 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                        ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                         in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc50 = *(vector<int,_std::allocator<int>_> **)pvVar11;
    pvVar11 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                        ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                         in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc40 = *(EnvironmentNAVXYTHETALAT **)(pvVar11 + 8);
    pvVar11 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                        ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
                         in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    fprintf(pFVar5,"%.3f %.3f %.3f\n",in_stack_fffffffffffffc50,(int)in_stack_fffffffffffffc40,
            *(undefined8 *)(pvVar11 + 0x10));
  }
  fclose(local_2a0);
  EnvironmentNAVXYTHETALATTICE::PrintTimeStat(local_268);
  if (local_20 == 0) {
    printf("Solution does not exist\n");
  }
  else {
    printf("Solution is found\n");
  }
  fflush((FILE *)0x0);
  if (local_288 != (ARAPlanner *)0x0) {
    (**(code **)(*(long *)local_288 + 0xa0))();
  }
  local_4 = local_20;
  local_28c = 1;
  std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~vector
            ((vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> *)
             in_stack_fffffffffffffc50);
LAB_0010dd6e:
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffc50);
  EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT((EnvironmentNAVXYTHETALAT *)local_268);
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~vector
            ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)in_stack_fffffffffffffc50);
  return local_4;
}

Assistant:

int planxythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; // in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    // set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01; //0.3;
    double halflength = 0.01; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    // clear the footprint
    perimeterptsV.clear();

    // Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETALAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set planner properties
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // plan
    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    printf("size of solution=%d\n", (unsigned int)solution_stateIDs_V.size());

    environment_navxythetalat.PrintTimeStat(stdout);

    // write solution to sol.txt
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // write the discrete solution to file
    for (size_t i = 0; i < solution_stateIDs_V.size(); i++) {
        int x;
        int y;
        int theta;
        environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[i], x, y, theta);
        fprintf(fSol, "%d %d %d\t\t%.3f %.3f %.3f\n", x, y, theta, DISCXY2CONT(x, 0.1), DISCXY2CONT(y, 0.1), DiscTheta2Cont(theta, 16));
    }

    // write the continuous solution to file
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    // print a path
    if (bRet) {
        // print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}